

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::DynamicState(DynamicState *this,DynamicState *other)

{
  uint uVar1;
  VkDynamicState *__first;
  reference pvVar2;
  allocator<vk::VkDynamicState> local_31;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_30;
  DynamicState *local_18;
  DynamicState *other_local;
  DynamicState *this_local;
  
  local_18 = other;
  other_local = this;
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&this->m_dynamicStates);
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       (local_18->super_VkPipelineDynamicStateCreateInfo).sType;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext =
       (local_18->super_VkPipelineDynamicStateCreateInfo).pNext;
  (this->super_VkPipelineDynamicStateCreateInfo).flags =
       (local_18->super_VkPipelineDynamicStateCreateInfo).flags;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount =
       (local_18->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  __first = (local_18->super_VkPipelineDynamicStateCreateInfo).pDynamicStates;
  uVar1 = (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  std::allocator<vk::VkDynamicState>::allocator(&local_31);
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator=
            (&this->m_dynamicStates,&local_30);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_30);
  std::allocator<vk::VkDynamicState>::~allocator(&local_31);
  pvVar2 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator[]
                     (&this->m_dynamicStates,0);
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates = pvVar2;
  return;
}

Assistant:

PipelineCreateInfo::DynamicState::DynamicState (const DynamicState &other)
{
	sType = other.sType;
	pNext = other.pNext;

	flags				= other.flags;
	dynamicStateCount	= other.dynamicStateCount;
	m_dynamicStates		= std::vector<vk::VkDynamicState>(other.pDynamicStates, other.pDynamicStates + dynamicStateCount);
	pDynamicStates		= &m_dynamicStates[0];
}